

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gim_tri_collision.cpp
# Opt level: O0

bool __thiscall
GIM_TRIANGLE_CALCULATION_CACHE::triangle_collision
          (GIM_TRIANGLE_CALCULATION_CACHE *this,btVector3 *u0,btVector3 *u1,btVector3 *u2,
          btScalar margin_u,btVector3 *v0,btVector3 *v1,btVector3 *v2,btScalar margin_v,
          GIM_TRIANGLE_CONTACT_DATA *contacts)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  btScalar *pbVar5;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  float *in_RDI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  float in_XMM0_Da;
  float fVar6;
  float in_XMM1_Da;
  float fVar7;
  undefined8 *in_stack_00000008;
  float *in_stack_00000010;
  uint point_count;
  uint bl;
  uint _y_1;
  btScalar _x_1;
  btScalar _pp_1;
  btScalar len_1;
  vec3f _dif2_1;
  vec3f _dif1_1;
  uint _y;
  btScalar _x;
  btScalar _pp;
  btScalar len;
  vec3f _dif2;
  vec3f _dif1;
  undefined4 in_stack_fffffffffffffbe8;
  btScalar bVar8;
  undefined4 in_stack_fffffffffffffbec;
  float in_stack_fffffffffffffbf8;
  float in_stack_fffffffffffffbfc;
  float in_stack_fffffffffffffc00;
  float in_stack_fffffffffffffc04;
  float local_3ec;
  float local_3e8;
  float local_3e4;
  float local_37c;
  float local_378;
  float local_374;
  float local_30c;
  float local_308;
  float local_304;
  float local_254;
  float local_250;
  float local_24c;
  float in_stack_fffffffffffffdb8;
  float in_stack_fffffffffffffdbc;
  btScalar in_stack_fffffffffffffdc0;
  float in_stack_fffffffffffffdc4;
  float in_stack_fffffffffffffdc8;
  float in_stack_fffffffffffffdcc;
  btScalar in_stack_fffffffffffffdd0;
  float in_stack_fffffffffffffdd4;
  btScalar in_stack_fffffffffffffdd8;
  float in_stack_fffffffffffffddc;
  float local_1cc;
  float local_1c8;
  float local_1c4;
  float local_15c;
  float local_158;
  float local_154;
  btScalar local_a0;
  uint local_9c;
  int local_98;
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  bool local_1;
  
  *in_RDI = in_XMM0_Da + in_XMM1_Da;
  *(undefined8 *)(in_RDI + 1) = *in_RSI;
  *(undefined8 *)(in_RDI + 3) = in_RSI[1];
  *(undefined8 *)(in_RDI + 5) = *in_RDX;
  *(undefined8 *)(in_RDI + 7) = in_RDX[1];
  *(undefined8 *)(in_RDI + 9) = *in_RCX;
  *(undefined8 *)(in_RDI + 0xb) = in_RCX[1];
  *(undefined8 *)(in_RDI + 0xd) = *in_R8;
  *(undefined8 *)(in_RDI + 0xf) = in_R8[1];
  *(undefined8 *)(in_RDI + 0x11) = *in_R9;
  *(undefined8 *)(in_RDI + 0x13) = in_R9[1];
  *(undefined8 *)(in_RDI + 0x15) = *in_stack_00000008;
  *(undefined8 *)(in_RDI + 0x17) = in_stack_00000008[1];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x11));
  fVar6 = *pbVar5;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
  local_50 = fVar6 - *pbVar5;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x11));
  fVar6 = pbVar5[1];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
  local_4c = fVar6 - pbVar5[1];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x11));
  fVar6 = pbVar5[2];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
  local_48 = fVar6 - pbVar5[2];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x15));
  fVar6 = *pbVar5;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
  local_5c = fVar6 - *pbVar5;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x15));
  fVar6 = pbVar5[1];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
  local_58 = fVar6 - pbVar5[1];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x15));
  fVar6 = pbVar5[2];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
  local_54 = fVar6 - pbVar5[2];
  fVar7 = local_48 * local_58;
  fVar6 = local_4c * local_54;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
  *pbVar5 = fVar6 + -fVar7;
  fVar7 = local_50 * local_54;
  fVar6 = local_48 * local_5c;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
  pbVar5[1] = fVar6 + -fVar7;
  fVar7 = local_4c * local_5c;
  fVar6 = local_50 * local_58;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
  pbVar5[2] = fVar6 + -fVar7;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
  fVar6 = *pbVar5;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
  fVar7 = *pbVar5;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
  fVar1 = pbVar5[1];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
  fVar2 = pbVar5[1];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
  fVar3 = pbVar5[2];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
  local_64 = fVar3 * pbVar5[2] + fVar6 * fVar7 + fVar1 * fVar2;
  if (1e-07 < local_64) {
    local_68 = local_64 * 0.5;
    local_6c = (float)(0x5f3759df - ((uint)local_64 >> 1));
    local_60 = local_6c * (-(local_68 * local_6c) * local_6c + 1.5);
  }
  else {
    local_60 = 3.4028235e+38;
  }
  fVar6 = local_60;
  if (local_60 < 3.4028235e+38) {
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
    fVar7 = local_60;
    *pbVar5 = fVar6 * *pbVar5;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
    fVar6 = local_60;
    pbVar5[1] = fVar7 * pbVar5[1];
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
    pbVar5[2] = fVar6 * pbVar5[2];
  }
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
  fVar6 = *pbVar5;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
  fVar7 = *pbVar5;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
  fVar1 = pbVar5[1];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
  fVar2 = pbVar5[1];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
  fVar3 = pbVar5[2];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
  fVar4 = pbVar5[2];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
  pbVar5[3] = fVar3 * fVar4 + fVar6 * fVar7 + fVar1 * fVar2;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
  fVar6 = *pbVar5;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
  fVar7 = *pbVar5;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
  fVar1 = pbVar5[1];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
  fVar2 = pbVar5[1];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
  fVar3 = pbVar5[2];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
  fVar4 = pbVar5[2];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
  in_RDI[0x31] = (fVar3 * fVar4 + fVar6 * fVar7 + fVar1 * fVar2) - pbVar5[3];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
  fVar6 = *pbVar5;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 5));
  fVar7 = *pbVar5;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
  fVar1 = pbVar5[1];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 5));
  fVar2 = pbVar5[1];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
  fVar3 = pbVar5[2];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 5));
  fVar4 = pbVar5[2];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
  in_RDI[0x32] = (fVar3 * fVar4 + fVar6 * fVar7 + fVar1 * fVar2) - pbVar5[3];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
  fVar6 = *pbVar5;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 9));
  fVar7 = *pbVar5;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
  fVar1 = pbVar5[1];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 9));
  fVar2 = pbVar5[1];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
  fVar3 = pbVar5[2];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 9));
  fVar4 = pbVar5[2];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
  in_RDI[0x33] = (fVar3 * fVar4 + fVar6 * fVar7 + fVar1 * fVar2) - pbVar5[3];
  in_RDI[0x35] = in_RDI[0x31] * in_RDI[0x32];
  in_RDI[0x36] = in_RDI[0x31] * in_RDI[0x33];
  if ((in_RDI[0x35] <= 0.0) || (in_RDI[0x36] <= 0.0)) {
    fVar6 = in_RDI[0x31];
    fVar7 = in_RDI[0x32];
    fVar1 = in_RDI[0x33];
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x2d));
    *pbVar5 = (fVar6 + fVar7 + fVar1) / 3.0;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x2d));
    if (0.0 < *pbVar5 || *pbVar5 == 0.0) {
      in_stack_fffffffffffffdb8 = in_RDI[0x31];
      if (in_RDI[0x32] < in_RDI[0x33] || in_RDI[0x32] == in_RDI[0x33]) {
        local_24c = in_RDI[0x32];
      }
      else {
        local_24c = in_RDI[0x33];
      }
      if (in_stack_fffffffffffffdb8 <= local_24c) {
        local_254 = in_RDI[0x31];
      }
      else {
        if (in_RDI[0x32] < in_RDI[0x33] || in_RDI[0x32] == in_RDI[0x33]) {
          local_250 = in_RDI[0x32];
        }
        else {
          local_250 = in_RDI[0x33];
        }
        local_254 = local_250;
      }
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x2d));
      *pbVar5 = local_254;
    }
    else {
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
      in_stack_fffffffffffffdd0 = *pbVar5;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x11));
      in_stack_fffffffffffffdd4 = in_stack_fffffffffffffdd0 + *pbVar5;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
      *pbVar5 = in_stack_fffffffffffffdd4;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
      in_stack_fffffffffffffdd8 = *pbVar5;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x11));
      in_stack_fffffffffffffddc = in_stack_fffffffffffffdd8 - *pbVar5;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x11));
      *pbVar5 = in_stack_fffffffffffffddc;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
      fVar6 = *pbVar5;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x11));
      fVar7 = *pbVar5;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
      *pbVar5 = fVar6 - fVar7;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
      fVar6 = pbVar5[1];
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x11));
      fVar7 = pbVar5[1];
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
      pbVar5[1] = fVar6 + fVar7;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
      fVar6 = pbVar5[1];
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x11));
      fVar7 = pbVar5[1];
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x11));
      pbVar5[1] = fVar6 - fVar7;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
      fVar6 = pbVar5[1];
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x11));
      fVar7 = pbVar5[1];
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
      pbVar5[1] = fVar6 - fVar7;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
      fVar6 = pbVar5[2];
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x11));
      fVar7 = pbVar5[2];
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
      pbVar5[2] = fVar6 + fVar7;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
      fVar6 = pbVar5[2];
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x11));
      fVar7 = pbVar5[2];
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x11));
      pbVar5[2] = fVar6 - fVar7;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
      fVar6 = pbVar5[2];
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x11));
      fVar7 = pbVar5[2];
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
      pbVar5[2] = fVar6 - fVar7;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
      fVar6 = *pbVar5;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
      *pbVar5 = fVar6 * -1.0;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
      fVar6 = pbVar5[1];
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
      pbVar5[1] = fVar6 * -1.0;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
      fVar6 = pbVar5[2];
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
      pbVar5[2] = fVar6 * -1.0;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
      fVar6 = pbVar5[3];
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
      pbVar5[3] = fVar6 * -1.0;
      if (in_RDI[0x33] <= in_RDI[0x32]) {
        in_stack_fffffffffffffdcc = in_RDI[0x32];
      }
      else {
        in_stack_fffffffffffffdcc = in_RDI[0x33];
      }
      if (in_stack_fffffffffffffdcc <= in_RDI[0x31]) {
        in_stack_fffffffffffffdbc = in_RDI[0x31];
      }
      else if (in_RDI[0x33] <= in_RDI[0x32]) {
        in_stack_fffffffffffffdbc = in_RDI[0x32];
        in_stack_fffffffffffffdc8 = in_stack_fffffffffffffdbc;
      }
      else {
        in_stack_fffffffffffffdbc = in_RDI[0x33];
        in_stack_fffffffffffffdc8 = in_stack_fffffffffffffdbc;
      }
      in_stack_fffffffffffffdc4 = in_stack_fffffffffffffdbc;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x2d));
      *pbVar5 = in_stack_fffffffffffffdbc;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x2d));
      in_stack_fffffffffffffdc0 = -*pbVar5;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x2d));
      *pbVar5 = in_stack_fffffffffffffdc0;
    }
  }
  else if (0.0 < in_RDI[0x31] || in_RDI[0x31] == 0.0) {
    if (in_RDI[0x32] < in_RDI[0x33] || in_RDI[0x32] == in_RDI[0x33]) {
      local_1c4 = in_RDI[0x32];
    }
    else {
      local_1c4 = in_RDI[0x33];
    }
    if (in_RDI[0x31] <= local_1c4) {
      local_1cc = in_RDI[0x31];
    }
    else {
      if (in_RDI[0x32] < in_RDI[0x33] || in_RDI[0x32] == in_RDI[0x33]) {
        local_1c8 = in_RDI[0x32];
      }
      else {
        local_1c8 = in_RDI[0x33];
      }
      local_1cc = local_1c8;
    }
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x2d));
    *pbVar5 = local_1cc;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x2d));
    if (*in_RDI <= *pbVar5 && *pbVar5 != *in_RDI) {
      return false;
    }
  }
  else {
    if (in_RDI[0x33] <= in_RDI[0x32]) {
      local_154 = in_RDI[0x32];
    }
    else {
      local_154 = in_RDI[0x33];
    }
    if (local_154 <= in_RDI[0x31]) {
      local_15c = in_RDI[0x31];
    }
    else {
      if (in_RDI[0x33] <= in_RDI[0x32]) {
        local_158 = in_RDI[0x32];
      }
      else {
        local_158 = in_RDI[0x33];
      }
      local_15c = local_158;
    }
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x2d));
    *pbVar5 = local_15c;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x2d));
    bVar8 = *pbVar5;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x2d));
    *pbVar5 = -bVar8;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x2d));
    if (*in_RDI <= *pbVar5 && *pbVar5 != *in_RDI) {
      return false;
    }
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
    fVar6 = *pbVar5;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x11));
    fVar7 = *pbVar5;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
    *pbVar5 = fVar6 + fVar7;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
    fVar6 = *pbVar5;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x11));
    fVar7 = *pbVar5;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x11));
    *pbVar5 = fVar6 - fVar7;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
    fVar6 = *pbVar5;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x11));
    fVar7 = *pbVar5;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
    *pbVar5 = fVar6 - fVar7;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
    fVar6 = pbVar5[1];
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x11));
    fVar7 = pbVar5[1];
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
    pbVar5[1] = fVar6 + fVar7;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
    fVar6 = pbVar5[1];
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x11));
    fVar7 = pbVar5[1];
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x11));
    pbVar5[1] = fVar6 - fVar7;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
    fVar6 = pbVar5[1];
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x11));
    fVar7 = pbVar5[1];
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
    pbVar5[1] = fVar6 - fVar7;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
    fVar6 = pbVar5[2];
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x11));
    fVar7 = pbVar5[2];
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
    pbVar5[2] = fVar6 + fVar7;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
    fVar6 = pbVar5[2];
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x11));
    fVar7 = pbVar5[2];
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x11));
    pbVar5[2] = fVar6 - fVar7;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
    fVar6 = pbVar5[2];
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x11));
    fVar7 = pbVar5[2];
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
    pbVar5[2] = fVar6 - fVar7;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
    fVar6 = *pbVar5;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
    *pbVar5 = fVar6 * -1.0;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
    fVar6 = pbVar5[1];
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
    pbVar5[1] = fVar6 * -1.0;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
    fVar6 = pbVar5[2];
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
    pbVar5[2] = fVar6 * -1.0;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
    fVar6 = pbVar5[3];
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x1d));
    pbVar5[3] = fVar6 * -1.0;
  }
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 5));
  fVar6 = *pbVar5;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
  local_78 = fVar6 - *pbVar5;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 5));
  fVar6 = pbVar5[1];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
  local_74 = fVar6 - pbVar5[1];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 5));
  fVar6 = pbVar5[2];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
  local_70 = fVar6 - pbVar5[2];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 9));
  fVar6 = *pbVar5;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
  local_84 = fVar6 - *pbVar5;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 9));
  fVar6 = pbVar5[1];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
  local_80 = fVar6 - pbVar5[1];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 9));
  fVar6 = pbVar5[2];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
  local_7c = fVar6 - pbVar5[2];
  fVar7 = local_70 * local_80;
  fVar6 = local_74 * local_7c;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
  *pbVar5 = fVar6 + -fVar7;
  fVar7 = local_78 * local_7c;
  fVar6 = local_70 * local_84;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
  pbVar5[1] = fVar6 + -fVar7;
  fVar7 = local_74 * local_84;
  fVar6 = local_78 * local_80;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
  pbVar5[2] = fVar6 + -fVar7;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
  fVar6 = *pbVar5;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
  fVar7 = *pbVar5;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
  fVar1 = pbVar5[1];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
  fVar2 = pbVar5[1];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
  fVar3 = pbVar5[2];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
  local_8c = fVar3 * pbVar5[2] + fVar6 * fVar7 + fVar1 * fVar2;
  if (1e-07 < local_8c) {
    local_90 = local_8c * 0.5;
    local_94 = (float)(0x5f3759df - ((uint)local_8c >> 1));
    local_88 = local_94 * (-(local_90 * local_94) * local_94 + 1.5);
  }
  else {
    local_88 = 3.4028235e+38;
  }
  fVar6 = local_88;
  if (local_88 < 3.4028235e+38) {
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
    fVar7 = local_88;
    *pbVar5 = fVar6 * *pbVar5;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
    fVar6 = local_88;
    pbVar5[1] = fVar7 * pbVar5[1];
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
    pbVar5[2] = fVar6 * pbVar5[2];
  }
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
  fVar6 = *pbVar5;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
  fVar7 = *pbVar5;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
  fVar1 = pbVar5[1];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
  fVar2 = pbVar5[1];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
  fVar3 = pbVar5[2];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
  fVar4 = pbVar5[2];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
  pbVar5[3] = fVar3 * fVar4 + fVar6 * fVar7 + fVar1 * fVar2;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
  fVar6 = *pbVar5;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
  fVar7 = *pbVar5;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
  fVar1 = pbVar5[1];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
  fVar2 = pbVar5[1];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
  fVar3 = pbVar5[2];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xd));
  fVar4 = pbVar5[2];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
  in_RDI[0x37] = (fVar3 * fVar4 + fVar6 * fVar7 + fVar1 * fVar2) - pbVar5[3];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
  fVar6 = *pbVar5;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x11));
  fVar7 = *pbVar5;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
  fVar1 = pbVar5[1];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x11));
  fVar2 = pbVar5[1];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
  fVar3 = pbVar5[2];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x11));
  fVar4 = pbVar5[2];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
  in_RDI[0x38] = (fVar3 * fVar4 + fVar6 * fVar7 + fVar1 * fVar2) - pbVar5[3];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
  fVar6 = *pbVar5;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x15));
  fVar7 = *pbVar5;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
  fVar1 = pbVar5[1];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x15));
  fVar2 = pbVar5[1];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
  fVar3 = pbVar5[2];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x15));
  fVar4 = pbVar5[2];
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
  in_RDI[0x39] = (fVar3 * fVar4 + fVar6 * fVar7 + fVar1 * fVar2) - pbVar5[3];
  in_RDI[0x3b] = in_RDI[0x37] * in_RDI[0x38];
  in_RDI[0x3c] = in_RDI[0x37] * in_RDI[0x39];
  if ((in_RDI[0x3b] <= 0.0) || (in_RDI[0x3c] <= 0.0)) {
    fVar6 = in_RDI[0x37];
    fVar7 = in_RDI[0x38];
    fVar1 = in_RDI[0x39];
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x2d));
    pbVar5[1] = (fVar6 + fVar7 + fVar1) / 3.0;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x2d));
    if (0.0 < pbVar5[1] || pbVar5[1] == 0.0) {
      if (in_RDI[0x38] < in_RDI[0x39] || in_RDI[0x38] == in_RDI[0x39]) {
        in_stack_fffffffffffffc04 = in_RDI[0x38];
      }
      else {
        in_stack_fffffffffffffc04 = in_RDI[0x39];
      }
      if (in_RDI[0x37] <= in_stack_fffffffffffffc04) {
        in_stack_fffffffffffffbf8 = in_RDI[0x37];
      }
      else if (in_RDI[0x38] < in_RDI[0x39] || in_RDI[0x38] == in_RDI[0x39]) {
        in_stack_fffffffffffffbf8 = in_RDI[0x38];
        in_stack_fffffffffffffc00 = in_stack_fffffffffffffbf8;
      }
      else {
        in_stack_fffffffffffffbf8 = in_RDI[0x39];
        in_stack_fffffffffffffc00 = in_stack_fffffffffffffbf8;
      }
      in_stack_fffffffffffffbfc = in_stack_fffffffffffffbf8;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x2d));
      pbVar5[1] = in_stack_fffffffffffffbf8;
    }
    else {
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
      fVar6 = *pbVar5;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 5));
      fVar7 = *pbVar5;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
      *pbVar5 = fVar6 + fVar7;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
      fVar6 = *pbVar5;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 5));
      fVar7 = *pbVar5;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 5));
      *pbVar5 = fVar6 - fVar7;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
      fVar6 = *pbVar5;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 5));
      fVar7 = *pbVar5;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
      *pbVar5 = fVar6 - fVar7;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
      fVar6 = pbVar5[1];
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 5));
      fVar7 = pbVar5[1];
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
      pbVar5[1] = fVar6 + fVar7;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
      fVar6 = pbVar5[1];
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 5));
      fVar7 = pbVar5[1];
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 5));
      pbVar5[1] = fVar6 - fVar7;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
      fVar6 = pbVar5[1];
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 5));
      fVar7 = pbVar5[1];
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
      pbVar5[1] = fVar6 - fVar7;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
      fVar6 = pbVar5[2];
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 5));
      fVar7 = pbVar5[2];
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
      pbVar5[2] = fVar6 + fVar7;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
      fVar6 = pbVar5[2];
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 5));
      fVar7 = pbVar5[2];
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 5));
      pbVar5[2] = fVar6 - fVar7;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
      fVar6 = pbVar5[2];
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 5));
      fVar7 = pbVar5[2];
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
      pbVar5[2] = fVar6 - fVar7;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
      fVar6 = *pbVar5;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
      *pbVar5 = fVar6 * -1.0;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
      fVar6 = pbVar5[1];
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
      pbVar5[1] = fVar6 * -1.0;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
      fVar6 = pbVar5[2];
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
      pbVar5[2] = fVar6 * -1.0;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
      fVar6 = pbVar5[3];
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
      pbVar5[3] = fVar6 * -1.0;
      if (in_RDI[0x39] <= in_RDI[0x38]) {
        local_3e4 = in_RDI[0x38];
      }
      else {
        local_3e4 = in_RDI[0x39];
      }
      if (local_3e4 <= in_RDI[0x37]) {
        local_3ec = in_RDI[0x37];
      }
      else {
        if (in_RDI[0x39] <= in_RDI[0x38]) {
          local_3e8 = in_RDI[0x38];
        }
        else {
          local_3e8 = in_RDI[0x39];
        }
        local_3ec = local_3e8;
      }
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x2d));
      pbVar5[1] = local_3ec;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x2d));
      bVar8 = pbVar5[1];
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x2d));
      pbVar5[1] = -bVar8;
    }
  }
  else if (0.0 < in_RDI[0x37] || in_RDI[0x37] == 0.0) {
    if (in_RDI[0x38] < in_RDI[0x39] || in_RDI[0x38] == in_RDI[0x39]) {
      local_374 = in_RDI[0x38];
    }
    else {
      local_374 = in_RDI[0x39];
    }
    if (in_RDI[0x37] <= local_374) {
      local_37c = in_RDI[0x37];
    }
    else {
      if (in_RDI[0x38] < in_RDI[0x39] || in_RDI[0x38] == in_RDI[0x39]) {
        local_378 = in_RDI[0x38];
      }
      else {
        local_378 = in_RDI[0x39];
      }
      local_37c = local_378;
    }
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x2d));
    pbVar5[1] = local_37c;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x2d));
    if (*in_RDI <= pbVar5[1] && pbVar5[1] != *in_RDI) {
      return false;
    }
  }
  else {
    if (in_RDI[0x39] <= in_RDI[0x38]) {
      local_304 = in_RDI[0x38];
    }
    else {
      local_304 = in_RDI[0x39];
    }
    if (local_304 <= in_RDI[0x37]) {
      local_30c = in_RDI[0x37];
    }
    else {
      if (in_RDI[0x39] <= in_RDI[0x38]) {
        local_308 = in_RDI[0x38];
      }
      else {
        local_308 = in_RDI[0x39];
      }
      local_30c = local_308;
    }
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x2d));
    pbVar5[1] = local_30c;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x2d));
    bVar8 = pbVar5[1];
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x2d));
    pbVar5[1] = -bVar8;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x2d));
    if (*in_RDI <= pbVar5[1] && pbVar5[1] != *in_RDI) {
      return false;
    }
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
    fVar6 = *pbVar5;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 5));
    fVar7 = *pbVar5;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
    *pbVar5 = fVar6 + fVar7;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
    fVar6 = *pbVar5;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 5));
    fVar7 = *pbVar5;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 5));
    *pbVar5 = fVar6 - fVar7;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
    fVar6 = *pbVar5;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 5));
    fVar7 = *pbVar5;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
    *pbVar5 = fVar6 - fVar7;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
    fVar6 = pbVar5[1];
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 5));
    fVar7 = pbVar5[1];
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
    pbVar5[1] = fVar6 + fVar7;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
    fVar6 = pbVar5[1];
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 5));
    fVar7 = pbVar5[1];
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 5));
    pbVar5[1] = fVar6 - fVar7;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
    fVar6 = pbVar5[1];
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 5));
    fVar7 = pbVar5[1];
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
    pbVar5[1] = fVar6 - fVar7;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
    fVar6 = pbVar5[2];
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 5));
    fVar7 = pbVar5[2];
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
    pbVar5[2] = fVar6 + fVar7;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
    fVar6 = pbVar5[2];
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 5));
    fVar7 = pbVar5[2];
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 5));
    pbVar5[2] = fVar6 - fVar7;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
    fVar6 = pbVar5[2];
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 5));
    fVar7 = pbVar5[2];
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 1));
    pbVar5[2] = fVar6 - fVar7;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
    fVar6 = *pbVar5;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
    *pbVar5 = fVar6 * -1.0;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
    fVar6 = pbVar5[1];
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
    pbVar5[1] = fVar6 * -1.0;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
    fVar6 = pbVar5[2];
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
    pbVar5[2] = fVar6 * -1.0;
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
    fVar6 = pbVar5[3];
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x19));
    pbVar5[3] = fVar6 * -1.0;
  }
  local_98 = 0;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x2d));
  bVar8 = *pbVar5;
  pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x2d));
  if (bVar8 < pbVar5[1]) {
    local_98 = 1;
  }
  if (local_98 == 2) {
    pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x2d));
    if (pbVar5[2] < *in_RDI || pbVar5[2] == *in_RDI) {
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x2d));
      *in_stack_00000010 = -pbVar5[2] + *in_RDI;
      *(undefined8 *)(in_stack_00000010 + 6) = *(undefined8 *)(in_RDI + 0x25);
      *(undefined8 *)(in_stack_00000010 + 8) = *(undefined8 *)(in_RDI + 0x27);
      in_stack_00000010[1] = 1.4013e-45;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x29));
      bVar8 = *pbVar5;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_stack_00000010 + 2));
      *pbVar5 = bVar8;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x29));
      bVar8 = pbVar5[1];
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_stack_00000010 + 2));
      pbVar5[1] = bVar8;
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x29));
      bVar8 = pbVar5[2];
      pbVar5 = btVector3::operator_cast_to_float_((btVector3 *)(in_stack_00000010 + 2));
      pbVar5[2] = bVar8;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    if (local_98 == 0) {
      local_9c = clip_triangle((GIM_TRIANGLE_CALCULATION_CACHE *)
                               CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                               (btVector4 *)
                               CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                               (btVector3 *)
                               CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                               (btVector3 *)
                               CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                               (btVector3 *)
                               CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      if (local_9c == 0) {
        return false;
      }
      GIM_TRIANGLE_CONTACT_DATA::merge_points
                ((GIM_TRIANGLE_CONTACT_DATA *)
                 CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                 (btVector4 *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),bVar8,
                 (btVector3 *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),0);
    }
    else {
      local_9c = clip_triangle((GIM_TRIANGLE_CALCULATION_CACHE *)
                               CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                               (btVector4 *)
                               CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                               (btVector3 *)
                               CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                               (btVector3 *)
                               CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                               (btVector3 *)
                               CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      if (local_9c == 0) {
        return false;
      }
      GIM_TRIANGLE_CONTACT_DATA::merge_points
                ((GIM_TRIANGLE_CONTACT_DATA *)
                 CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                 (btVector4 *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),bVar8,
                 (btVector3 *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),0);
      local_a0 = -1.0;
      btVector3::operator*=((btVector3 *)(in_stack_00000010 + 2),&local_a0);
    }
    if (in_stack_00000010[1] == 0.0) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

SIMD_FORCE_INLINE bool triangle_collision(
					const btVector3 & u0,
					const btVector3 & u1,
					const btVector3 & u2,
					GREAL margin_u,
					const btVector3 & v0,
					const btVector3 & v1,
					const btVector3 & v2,
					GREAL margin_v,
					GIM_TRIANGLE_CONTACT_DATA & contacts)
	{

		margin = margin_u + margin_v;

		tu_vertices[0] = u0;
		tu_vertices[1] = u1;
		tu_vertices[2] = u2;

		tv_vertices[0] = v0;
		tv_vertices[1] = v1;
		tv_vertices[2] = v2;

		//create planes
		// plane v vs U points

		TRIANGLE_PLANE(tv_vertices[0],tv_vertices[1],tv_vertices[2],tv_plane);

		du[0] = DISTANCE_PLANE_POINT(tv_plane,tu_vertices[0]);
		du[1] = DISTANCE_PLANE_POINT(tv_plane,tu_vertices[1]);
		du[2] = DISTANCE_PLANE_POINT(tv_plane,tu_vertices[2]);


		du0du1 = du[0] * du[1];
		du0du2 = du[0] * du[2];


		if(du0du1>0.0f && du0du2>0.0f)	// same sign on all of them + not equal 0 ?
		{
			if(du[0]<0) //we need test behind the triangle plane
			{
				distances[0] = GIM_MAX3(du[0],du[1],du[2]);
				distances[0] = -distances[0];
				if(distances[0]>margin) return false; //never intersect

				//reorder triangle v
				VEC_SWAP(tv_vertices[0],tv_vertices[1]);
				VEC_SCALE_4(tv_plane,-1.0f,tv_plane);
			}
			else
			{
				distances[0] = GIM_MIN3(du[0],du[1],du[2]);
				if(distances[0]>margin) return false; //never intersect
			}
		}
		else
		{
			//Look if we need to invert the triangle
			distances[0] = (du[0]+du[1]+du[2])/3.0f; //centroid

			if(distances[0]<0.0f)
			{
				//reorder triangle v
				VEC_SWAP(tv_vertices[0],tv_vertices[1]);
				VEC_SCALE_4(tv_plane,-1.0f,tv_plane);

				distances[0] = GIM_MAX3(du[0],du[1],du[2]);
				distances[0] = -distances[0];
			}
			else
			{
				distances[0] = GIM_MIN3(du[0],du[1],du[2]);
			}
		}


		// plane U vs V points

		TRIANGLE_PLANE(tu_vertices[0],tu_vertices[1],tu_vertices[2],tu_plane);

		dv[0] = DISTANCE_PLANE_POINT(tu_plane,tv_vertices[0]);
		dv[1] = DISTANCE_PLANE_POINT(tu_plane,tv_vertices[1]);
		dv[2] = DISTANCE_PLANE_POINT(tu_plane,tv_vertices[2]);

		dv0dv1 = dv[0] * dv[1];
		dv0dv2 = dv[0] * dv[2];


		if(dv0dv1>0.0f && dv0dv2>0.0f)	// same sign on all of them + not equal 0 ?
		{
			if(dv[0]<0) //we need test behind the triangle plane
			{
				distances[1] = GIM_MAX3(dv[0],dv[1],dv[2]);
				distances[1] = -distances[1];
				if(distances[1]>margin) return false; //never intersect

				//reorder triangle u
				VEC_SWAP(tu_vertices[0],tu_vertices[1]);
				VEC_SCALE_4(tu_plane,-1.0f,tu_plane);
			}
			else
			{
				distances[1] = GIM_MIN3(dv[0],dv[1],dv[2]);
				if(distances[1]>margin) return false; //never intersect
			}
		}
		else
		{
			//Look if we need to invert the triangle
			distances[1] = (dv[0]+dv[1]+dv[2])/3.0f; //centroid

			if(distances[1]<0.0f)
			{
				//reorder triangle v
				VEC_SWAP(tu_vertices[0],tu_vertices[1]);
				VEC_SCALE_4(tu_plane,-1.0f,tu_plane);

				distances[1] = GIM_MAX3(dv[0],dv[1],dv[2]);
				distances[1] = -distances[1];
			}
			else
			{
				distances[1] = GIM_MIN3(dv[0],dv[1],dv[2]);
			}
		}

		GUINT bl;
		/* bl = cross_line_intersection_test();
		if(bl==3)
		{
			//take edge direction too
			bl = distances.maxAxis();
		}
		else
		{*/
			bl = 0;
			if(distances[0]<distances[1]) bl = 1;
		//}

		if(bl==2) //edge edge separation
		{
			if(distances[2]>margin) return false;

			contacts.m_penetration_depth = -distances[2] + margin;
			contacts.m_points[0] = closest_point_v;
			contacts.m_point_count = 1;
			VEC_COPY(contacts.m_separating_normal,edge_edge_dir);

			return true;
		}

		//clip face against other

		
		GUINT point_count;
		//TODO
		if(bl == 0) //clip U points against V
		{
			point_count = clip_triangle(tv_plane,tv_vertices,tu_vertices,contact_points);
			if(point_count == 0) return false;						
			contacts.merge_points(tv_plane,margin,contact_points,point_count);			
		}
		else //clip V points against U
		{
			point_count = clip_triangle(tu_plane,tu_vertices,tv_vertices,contact_points);
			if(point_count == 0) return false;			
			contacts.merge_points(tu_plane,margin,contact_points,point_count);
			contacts.m_separating_normal *= -1.f;
		}
		if(contacts.m_point_count == 0) return false;
		return true;
	}